

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<kj::ReadableDirectory::Entry>::~Array(Array<kj::ReadableDirectory::Entry> *this)

{
  Entry *pEVar1;
  size_t sVar2;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (Entry *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Entry *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x20,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }